

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage destImage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Allocator *pAVar4;
  long lVar5;
  undefined8 uVar6;
  uint uVar7;
  deUint32 dVar8;
  int iVar9;
  VkResult VVar10;
  deUint32 dVar11;
  VkDevice_s *device;
  DeviceDriver *vk;
  VkQueue pVVar12;
  pointer pvVar13;
  uint value;
  VkDeviceSize size;
  TextureFormat *format;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ConstPixelBufferAccess *access;
  pointer pCVar17;
  long lVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  VkImageMemoryBarrier postImageBarrier;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  VkImageMemoryBarrier preImageBarrier;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkSubmitInfo submitInfo;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkBufferMemoryBarrier preBufferBarrier;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  PixelBufferAccess destAccess;
  
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    device = (((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  }
  else {
    device = Context::getDevice((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    vk = &((this->m_sparseContext).
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
           .m_data.ptr)->m_deviceInterface;
  }
  else {
    vk = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    pVVar12 = ((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_queue;
  }
  else {
    pVVar12 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    dVar11 = ((this->m_sparseContext).
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.ptr)->m_queueFamilyIndex;
  }
  else {
    dVar11 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  }
  uVar7 = 2 - (refSampler->compare == COMPAREMODE_NONE);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  preImageBarrier.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&offsetMultiples,(iterator)0x0,&preImageBarrier.sType);
  preImageBarrier.sType = tcu::TextureFormat::getPixelSize(texFormat);
  if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&offsetMultiples,
               (iterator)
               offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,&preImageBarrier.sType);
  }
  else {
    *offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = preImageBarrier.sType;
    offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  pvVar13 = (textureData->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar13 ==
      (textureData->
      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    size = 0;
  }
  else {
    value = 0;
    do {
      pCVar17 = (pvVar13->
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                )._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pCVar17 ==
            (pvVar13->
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            )._M_impl.super__Vector_impl_data._M_finish) break;
        dVar8 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,value);
        iVar1 = (pCVar17->m_size).m_data[0];
        iVar2 = (pCVar17->m_size).m_data[1];
        iVar3 = (pCVar17->m_size).m_data[2];
        iVar9 = tcu::TextureFormat::getPixelSize(&pCVar17->m_format);
        value = iVar3 * iVar9 * iVar2 * iVar1 + dVar8;
        pCVar17 = pCVar17 + 1;
      }
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 !=
             (textureData->
             super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    size = (VkDeviceSize)value;
  }
  preImageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  preImageBarrier.pNext = (void *)0x0;
  preImageBarrier._16_8_ = (ulong)preImageBarrier.dstAccessMask << 0x20;
  preImageBarrier.srcQueueFamilyIndex = 1;
  preImageBarrier.dstQueueFamilyIndex = 0;
  preImageBarrier.image.m_internal = (ulong)preImageBarrier.image.m_internal._4_4_ << 0x20;
  preImageBarrier.subresourceRange.aspectMask = 0;
  preImageBarrier.subresourceRange.baseMipLevel = 0;
  preImageBarrier._24_8_ = size;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,&vk->super_DeviceInterface,
                     device,(VkBufferCreateInfo *)&preImageBarrier,(VkAllocationCallbacks *)0x0);
  postImageBarrier.newLayout = submitInfo.pWaitSemaphores._4_4_;
  postImageBarrier.oldLayout = (VkImageLayout)submitInfo.pWaitSemaphores;
  postImageBarrier.srcAccessMask = submitInfo.waitSemaphoreCount;
  postImageBarrier.dstAccessMask = submitInfo._20_4_;
  postImageBarrier.sType = submitInfo.sType;
  postImageBarrier._4_4_ = submitInfo._4_4_;
  postImageBarrier.pNext = submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)postImageBarrier._16_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)postImageBarrier._24_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       postImageBarrier._0_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)postImageBarrier.pNext;
  if (submitInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&submitInfo.pNext,
               (VkBuffer)submitInfo._0_8_);
  }
  pAVar4 = this->m_memAlloc;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&postImageBarrier,&vk->super_DeviceInterface,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar4->_vptr_Allocator[3])(&submitInfo,pAVar4,&postImageBarrier,1);
  uVar6 = submitInfo._0_8_;
  VVar10 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xc])
                     (vk,device,
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                      *(undefined8 *)(submitInfo._0_8_ + 8),*(undefined8 *)(submitInfo._0_8_ + 0x10)
                     );
  ::vk::checkResult(VVar10,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x440);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier,&vk->super_DeviceInterface,
             device,1,dVar11,(VkAllocationCallbacks *)0x0);
  preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
  preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
  preImageBarrier.oldLayout = postImageBarrier.oldLayout;
  preImageBarrier.newLayout = postImageBarrier.newLayout;
  preImageBarrier.sType = postImageBarrier.sType;
  preImageBarrier._4_4_ = postImageBarrier._4_4_;
  preImageBarrier.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)preImageBarrier._16_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)preImageBarrier._24_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       preImageBarrier._0_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)preImageBarrier.pNext;
  if (postImageBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier.pNext,
               (VkCommandPool)postImageBarrier._0_8_);
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&postImageBarrier,&vk->super_DeviceInterface,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
  preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
  preImageBarrier.oldLayout = postImageBarrier.oldLayout;
  preImageBarrier.newLayout = postImageBarrier.newLayout;
  preImageBarrier.sType = postImageBarrier.sType;
  preImageBarrier._4_4_ = postImageBarrier._4_4_;
  preImageBarrier.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    submitInfo._0_8_ = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal);
  }
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(preImageBarrier.dstAccessMask,preImageBarrier.srcAccessMask);
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._4_4_ =
       preImageBarrier.newLayout;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ =
       preImageBarrier.oldLayout;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)preImageBarrier._0_8_;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)preImageBarrier.pNext;
  if (postImageBarrier._0_8_ != 0) {
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    (**(code **)(*postImageBarrier.pNext + 0x240))
              (postImageBarrier.pNext,postImageBarrier._16_8_,postImageBarrier._24_8_);
  }
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&postImageBarrier,
                    &vk->super_DeviceInterface,device,0,(VkAllocationCallbacks *)0x0);
  preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
  preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
  preImageBarrier.oldLayout = postImageBarrier.oldLayout;
  preImageBarrier.newLayout = postImageBarrier.newLayout;
  preImageBarrier.sType = postImageBarrier.sType;
  preImageBarrier._4_4_ = postImageBarrier._4_4_;
  preImageBarrier.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
              );
  }
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)preImageBarrier._16_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)preImageBarrier._24_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
       preImageBarrier._0_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)preImageBarrier.pNext;
  if (postImageBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&postImageBarrier.pNext,
               (VkFence)postImageBarrier._0_8_);
  }
  preBufferBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  dVar11 = 0;
  preBufferBarrier.pNext = (void *)0x0;
  preBufferBarrier.srcAccessMask = 0x4000;
  preBufferBarrier.dstAccessMask = 0x800;
  preBufferBarrier.srcQueueFamilyIndex = 0xffffffff;
  preBufferBarrier.dstQueueFamilyIndex = 0xffffffff;
  preBufferBarrier.buffer.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  preBufferBarrier.offset = 0;
  preImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  preImageBarrier.pNext = (void *)0x0;
  preImageBarrier.srcAccessMask = 0;
  preImageBarrier.dstAccessMask = 0x1000;
  preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  preImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  preImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  preImageBarrier.image = destImage;
  preImageBarrier.subresourceRange.baseMipLevel = 0;
  preImageBarrier.subresourceRange.aspectMask = uVar7;
  preImageBarrier.subresourceRange.baseArrayLayer = 0;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x1000;
  postImageBarrier.dstAccessMask = 0x20;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.image = destImage;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  pvVar13 = (textureData->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  postImageBarrier.subresourceRange.aspectMask = uVar7;
  postImageBarrier.subresourceRange.levelCount = mipLevels;
  postImageBarrier.subresourceRange.layerCount = arrayLayers;
  preImageBarrier.subresourceRange.levelCount = mipLevels;
  preImageBarrier.subresourceRange.layerCount = arrayLayers;
  preBufferBarrier.size = size;
  if ((textureData->
      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar5 = *(long *)(uVar6 + 0x18);
    uVar15 = 0;
    do {
      pCVar17 = pvVar13[uVar15].
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar13[uVar15].
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar17) {
        lVar18 = 8;
        uVar14 = 0;
        do {
          dVar11 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,dVar11);
          format = (TextureFormat *)((long)(pCVar17->m_size).m_data + lVar18 + -0x10);
          uVar16 = (ulong)dVar11;
          tcu::PixelBufferAccess::PixelBufferAccess
                    (&destAccess,format,(IVec3 *)((long)(pCVar17->m_size).m_data + lVar18 + -8),
                     (void *)(lVar5 + uVar16));
          submitInfo.pNext =
               (void *)CONCAT44(*(undefined4 *)((long)(pCVar17->m_size).m_data + lVar18 + -4),
                                *(undefined4 *)((long)(pCVar17->m_size).m_data + lVar18 + -8));
          submitInfo._20_4_ = (int)uVar15;
          submitInfo.waitSemaphoreCount = uVar7;
          submitInfo.pWaitSemaphores._0_4_ = (VkImageLayout)uVar14;
          submitInfo.pWaitSemaphores._4_4_ = 1;
          submitInfo.pWaitDstStageMask._0_4_ = 0;
          submitInfo.pWaitDstStageMask._4_4_ = 0;
          submitInfo.commandBufferCount = 0;
          submitInfo._44_4_ = *(uint *)((long)(pCVar17->m_size).m_data + lVar18 + -8);
          submitInfo.pCommandBuffers =
               (VkCommandBuffer *)
               CONCAT44(*(undefined4 *)((long)(pCVar17->m_size).m_data + lVar18),
                        *(undefined4 *)((long)(pCVar17->m_size).m_data + lVar18 + -4));
          submitInfo._0_8_ = uVar16;
          if (copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
            _M_realloc_insert<vk::VkBufferImageCopy_const&>
                      ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>> *)
                       &copyRegions,
                       (iterator)
                       copyRegions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(VkBufferImageCopy *)&submitInfo);
          }
          else {
            *(VkCommandBuffer **)
             &((copyRegions.
                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                _M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
                 submitInfo.pCommandBuffers;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = 0;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = 0;
            *(ulong *)&((copyRegions.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
                 (ulong)(uint)submitInfo._44_4_ << 0x20;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask = uVar7;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel = (int)uVar15;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).baseArrayLayer =
                 (VkImageLayout)submitInfo.pWaitSemaphores;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount = 1;
            (copyRegions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_finish)->bufferOffset = uVar16;
            *(void **)&(copyRegions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
                 submitInfo.pNext;
            copyRegions.
            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 copyRegions.
                 super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          tcu::copy((EVP_PKEY_CTX *)&destAccess,(EVP_PKEY_CTX *)format);
          iVar1 = *(int *)((long)(pCVar17->m_size).m_data + lVar18 + -8);
          iVar2 = *(int *)((long)(pCVar17->m_size).m_data + lVar18 + -4);
          iVar3 = *(int *)((long)(pCVar17->m_size).m_data + lVar18);
          iVar9 = tcu::TextureFormat::getPixelSize(format);
          dVar11 = iVar3 * iVar9 * iVar2 * iVar1 + dVar11;
          uVar14 = uVar14 + 1;
          pCVar17 = pvVar13[uVar15].
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x28;
        } while (uVar14 < (ulong)(((long)pvVar13[uVar15].
                                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17
                                  >> 3) * -0x3333333333333333));
      }
      uVar15 = uVar15 + 1;
      pvVar13 = (textureData->
                super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)(((long)(textureData->
                                     super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >>
                              3) * -0x5555555555555555));
  }
  ::vk::flushMappedMemoryRange
            (&vk->super_DeviceInterface,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),
             *(VkDeviceSize *)(uVar6 + 0x10),size);
  VVar10 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                     (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                      &cmdBufferBeginInfo);
  ::vk::checkResult(VVar10,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4b6);
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x4000,0x1000,0,0,0,1
             ,&preBufferBarrier,1,&preImageBarrier);
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x62])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             destImage.m_internal,7,
             (ulong)(uint)((int)((ulong)((long)copyRegions.
                                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)copyRegions.
                                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249),
             copyRegions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,1,0,0,0,0,0,1,
             &postImageBarrier);
  VVar10 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x4a])
                     (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar10,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ba);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo._44_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
  VVar10 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[2])
                     (vk,pVVar12,1,&submitInfo,
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal);
  ::vk::checkResult(VVar10,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4c9);
  VVar10 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                     (vk,device,1,&fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar10,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ca);
  if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)offsetMultiples.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)offsetMultiples.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(copyRegions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
              );
  }
  if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    preImageBarrier._0_8_ = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  if (uVar6 != 0) {
    (**(code **)(*(long *)uVar6 + 8))(uVar6);
  }
  if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::uploadImage (const tcu::TextureFormat&			texFormat,
											const TextureData&					textureData,
											const tcu::Sampler&					refSampler,
											deUint32							mipLevels,
											deUint32							arrayLayers,
											VkImage								destImage)
{
	const VkDevice					vkDevice				= getDevice();
	const DeviceInterface&			vk						= getDeviceInterface();
	const VkQueue					queue					= getUniversalQueue();
	const deUint32					queueFamilyIndex		= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	deUint32						bufferSize				= 0u;
	Move<VkBuffer>					buffer;
	de::MovePtr<Allocation>			bufferAlloc;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;
	std::vector<VkBufferImageCopy>	copyRegions;
	std::vector<deUint32>			offsetMultiples;

	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	// Create source buffer
	{
		const VkBufferCreateInfo bufferParams =
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			0u,											// deUint32				queueFamilyIndexCount;
			DE_NULL,									// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Create command pool and buffer
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}